

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

char * cmState::GetTargetTypeName(TargetType targetType)

{
  if (targetType < (UNKNOWN_LIBRARY|STATIC_LIBRARY)) {
    return &DAT_0050e238 + *(int *)(&DAT_0050e238 + (ulong)targetType * 4);
  }
  __assert_fail("0 && \"Unexpected target type\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                ,0x80,"static const char *cmState::GetTargetTypeName(cmState::TargetType)");
}

Assistant:

const char* cmState::GetTargetTypeName(cmState::TargetType targetType)
{
  switch( targetType )
    {
      case cmState::STATIC_LIBRARY:
        return "STATIC_LIBRARY";
      case cmState::MODULE_LIBRARY:
        return "MODULE_LIBRARY";
      case cmState::SHARED_LIBRARY:
        return "SHARED_LIBRARY";
      case cmState::OBJECT_LIBRARY:
        return "OBJECT_LIBRARY";
      case cmState::EXECUTABLE:
        return "EXECUTABLE";
      case cmState::UTILITY:
        return "UTILITY";
      case cmState::GLOBAL_TARGET:
        return "GLOBAL_TARGET";
      case cmState::INTERFACE_LIBRARY:
        return "INTERFACE_LIBRARY";
      case cmState::UNKNOWN_LIBRARY:
        return "UNKNOWN_LIBRARY";
    }
  assert(0 && "Unexpected target type");
  return 0;
}